

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

ARKRhsFn mriStep_GetImplicitRHS(void *arkode_mem)

{
  int iVar1;
  ARKRhsFn p_Var2;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem local_10;
  ARKodeMem local_8;
  
  iVar1 = mriStep_AccessStepMem(arkode_mem,"mriStep_GetImplicitRHS",&local_8,&local_10);
  if ((iVar1 == 0) && (local_10->implicit_rhs != 0)) {
    p_Var2 = local_10->fsi;
  }
  else {
    p_Var2 = (ARKRhsFn)0x0;
  }
  return p_Var2;
}

Assistant:

ARKRhsFn mriStep_GetImplicitRHS(void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure, and return fi */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_GetImplicitRHS",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(NULL);
  if (step_mem->implicit_rhs) {
    return(step_mem->fsi);
  } else {
    return(NULL);
  }
}